

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logconf.c
# Opt level: O1

char * append_unsafe_string_json(char *pos,char *src,size_t len)

{
  char cVar1;
  size_t sVar2;
  
  if (len != 0) {
    sVar2 = 0;
    do {
      cVar1 = src[sVar2];
      if ((byte)(cVar1 - 0x20U) < 0x5e) {
        if ((cVar1 == '\\') || (cVar1 == '\"')) {
          *pos = '\\';
          pos = pos + 1;
        }
        *pos = src[sVar2];
        pos = pos + 1;
      }
      else {
        pos[0] = '\\';
        pos[1] = 'u';
        pos[2] = '0';
        pos[3] = '0';
        pos[4] = "0123456789abcdef"[(byte)src[sVar2] >> 4];
        pos[5] = "0123456789abcdef"[(byte)src[sVar2] & 0xf];
        pos = pos + 6;
      }
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
  }
  return pos;
}

Assistant:

static char *append_unsafe_string_json(char *pos, const char *src, size_t len)
{
    const char *src_end = src + len;

    for (; src != src_end; ++src) {
        if (' ' <= *src && *src < 0x7e) {
            if (*src == '"' || *src == '\\')
                *pos++ = '\\';
            *pos++ = *src;
        } else {
            *pos++ = '\\';
            *pos++ = 'u';
            *pos++ = '0';
            *pos++ = '0';
            *pos++ = ("0123456789abcdef")[(*src >> 4) & 0xf];
            *pos++ = ("0123456789abcdef")[*src & 0xf];
        }
    }

    return pos;
}